

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O1

void helper_gvec_fcmlas_arm(void *vd,void *vn,void *vm,void *vfpst,uint32_t desc)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  float32 fVar4;
  float32 fVar5;
  ulong uVar7;
  ulong uVar8;
  uintptr_t i;
  ulong uVar6;
  
  uVar2 = desc * 8 & 0xff;
  uVar3 = uVar2 + 8;
  uVar6 = (ulong)uVar3;
  uVar7 = (ulong)(desc >> 8 & 4);
  uVar8 = 0;
  do {
    fVar5 = *(float32 *)((long)vn + uVar8 * 4 + uVar7);
    uVar1 = *(uint *)((long)vm + uVar8 * 4 + (4 - uVar7));
    fVar4 = float32_muladd_arm(fVar5,*(uint *)((long)vm + uVar8 * 4 + uVar7) ^
                                     (desc >> 10 ^ desc >> 0xb) << 0x1f,
                               *(float32 *)((long)vd + uVar8 * 4),0,(float_status *)vfpst);
    *(float32 *)((long)vd + uVar8 * 4) = fVar4;
    fVar5 = float32_muladd_arm(fVar5,uVar1 ^ (desc >> 0xb) << 0x1f,
                               *(float32 *)((long)vd + uVar8 * 4 + 4),0,(float_status *)vfpst);
    *(float32 *)((long)vd + uVar8 * 4 + 4) = fVar5;
    uVar8 = uVar8 + 2;
  } while (uVar8 < uVar3 >> 2);
  uVar3 = desc >> 2 & 0xf8;
  if (uVar2 < uVar3) {
    uVar8 = (ulong)(uVar3 + 8);
    uVar7 = uVar6 + 8;
    if (uVar6 + 8 < uVar8) {
      uVar7 = uVar8;
    }
    memset((void *)((long)vd + uVar6),0,(~uVar6 + uVar7 & 0xfffffffffffffff8) + 8);
    return;
  }
  return;
}

Assistant:

void HELPER(gvec_fcmlas)(void *vd, void *vn, void *vm,
                         void *vfpst, uint32_t desc)
{
    uintptr_t opr_sz = simd_oprsz(desc);
    float32 *d = vd;
    float32 *n = vn;
    float32 *m = vm;
    float_status *fpst = vfpst;
    intptr_t flip = extract32(desc, SIMD_DATA_SHIFT, 1);
    uint32_t neg_imag = extract32(desc, SIMD_DATA_SHIFT + 1, 1);
    uint32_t neg_real = flip ^ neg_imag;
    uintptr_t i;

    /* Shift boolean to the sign bit so we can xor to negate.  */
    neg_real <<= 31;
    neg_imag <<= 31;

    for (i = 0; i < opr_sz / 4; i += 2) {
        float32 e2 = n[H4(i + flip)];
        float32 e1 = m[H4(i + flip)] ^ neg_real;
        float32 e4 = e2;
        float32 e3 = m[H4(i + 1 - flip)] ^ neg_imag;

        d[H4(i)] = float32_muladd(e2, e1, d[H4(i)], 0, fpst);
        d[H4(i + 1)] = float32_muladd(e4, e3, d[H4(i + 1)], 0, fpst);
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}